

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::iterator::insert
          (iterator *this,unsigned_long left,unsigned_long right,NetAlias **value,
          allocator_type *alloc)

{
  Path *this_00;
  IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U> *this_01;
  long lVar1;
  ulong uVar2;
  int iVar3;
  uint32_t uVar4;
  uintptr_t intWord;
  IndexPair offset;
  size_type sVar5;
  long lVar6;
  pointer pEVar7;
  long lVar8;
  uint uVar9;
  unsigned_long uVar10;
  ulong uVar11;
  interval<unsigned_long> ival;
  interval<unsigned_long> local_38;
  
  this_01 = (this->super_const_iterator).map;
  this_00 = &(this->super_const_iterator).path;
  local_38.left = left;
  local_38.right = right;
  if (this_01->height == 0) {
    uVar4 = IntervalMapDetails::
            LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true>::insertFrom
                      ((LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true>
                        *)this_01,
                       (this->super_const_iterator).path.path.
                       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                       [(this->super_const_iterator).path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                       offset,this_01->rootSize,&local_38,value);
    if (uVar4 < 9) {
      this_01->rootSize = uVar4;
      ((this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->size =
           uVar4;
      return;
    }
    offset = IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>::
             modifyRoot<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Compilation::NetAlias_const*,8u,true>,slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Compilation::NetAlias_const*,8u,false>,true>
                       ((IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u> *)
                        this_01,(LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true>
                                 *)this_01,
                        (this->super_const_iterator).path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                        [(this->super_const_iterator).path.path.
                         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                        offset,alloc);
    IntervalMapDetails::Path::
    replaceRoot<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,true>>
              (this_00,(BranchNode<unsigned_long,_8U,_true> *)this_01,this_01->rootSize,offset);
  }
  sVar5 = (this->super_const_iterator).path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if ((sVar5 == 0) ||
     (pEVar7 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar7->size <= pEVar7->offset)) {
    IntervalMapDetails::Path::legalizeForInsert(this_00,((this->super_const_iterator).map)->height);
    pEVar7 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    sVar5 = (this->super_const_iterator).path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  }
  uVar4 = IntervalMapDetails::
          LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_false>::insertFrom
                    ((LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_false>
                      *)pEVar7[sVar5 - 1].node,pEVar7[sVar5 - 1].offset,pEVar7[sVar5 - 1].size,
                     &local_38,value);
  if (8 < uVar4) {
    IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>::iterator::
    overflow<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Compilation::NetAlias_const*,8u,false>>
              ((iterator *)this,
               (int)(this->super_const_iterator).path.path.
                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1,alloc);
    pEVar7 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    sVar5 = (this->super_const_iterator).path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
    uVar4 = IntervalMapDetails::
            LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_false>::
            insertFrom((LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_false>
                        *)pEVar7[sVar5 - 1].node,pEVar7[sVar5 - 1].offset,pEVar7[sVar5 - 1].size,
                       &local_38,value);
  }
  pEVar7 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  iVar3 = (int)(this->super_const_iterator).path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  uVar9 = iVar3 - 1;
  lVar8 = (ulong)uVar9 * 0x10;
  pEVar7[uVar9].size = uVar4;
  if (uVar9 != 0) {
    uVar9 = iVar3 - 2;
    *(ulong *)((long)pEVar7[uVar9].node + (ulong)pEVar7[uVar9].offset * 8) =
         *(ulong *)((long)pEVar7[uVar9].node + (ulong)pEVar7[uVar9].offset * 8) & 0xffffffffffffffc0
         | (ulong)(uVar4 - 1);
    do {
      lVar1 = *(long *)((long)&pEVar7[-1].node + lVar8);
      lVar6 = (ulong)*(uint *)((long)pEVar7 + lVar8 + -4) * 0x10;
      uVar11 = *(ulong *)(lVar1 + 0x40 + lVar6);
      uVar2 = *(ulong *)(lVar1 + 0x48 + lVar6);
      if (local_38.left < uVar11) {
        uVar11 = local_38.left;
      }
      *(ulong *)(lVar1 + 0x40 + lVar6) = uVar11;
      uVar10 = local_38.right;
      if (local_38.right < uVar2) {
        uVar10 = uVar2;
      }
      *(unsigned_long *)(lVar1 + 0x48 + lVar6) = uVar10;
      lVar8 = lVar8 + -0x10;
    } while (lVar8 != 0);
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::insert(TKey left, TKey right, const TValue& value,
                                                    allocator_type& alloc) {
    using namespace IntervalMapDetails;

    auto& map = *this->map;
    auto& path = this->path;

    interval<TKey> ival{left, right};
    if (this->isFlat()) {
        // Try simple root leaf insert first.
        uint32_t size = map.rootLeaf.insertFrom(path.leafOffset(), map.rootSize, ival, value);
        if (size <= RootLeaf::Capacity) {
            map.rootSize = size;
            path.setSize(0, size);
            return;
        }

        // Root is full, we need to branch.
        auto offset = map.switchToBranch(path.leafOffset(), alloc);
        path.replaceRoot(&map.rootBranch, map.rootSize, offset);
    }

    if (!path.valid())
        path.legalizeForInsert(this->map->height);

    uint32_t size = path.leafSize();
    size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), size, ival, value);

    if (size > Leaf::Capacity) {
        // If the new element didn't fit, overflow the node and try again.
        overflow<Leaf>(path.height(), alloc);
        size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), path.leafSize(), ival,
                                                     value);
    }

    // Update path to match the newly inserted element.
    path.setSize(path.height(), size);
    updateParentBounds(path.height(), ival);
}